

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall VectorsTest_Int3Volume_Test::TestBody(VectorsTest_Int3Volume_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar;
  Int3 v;
  int *in_stack_ffffffffffffff90;
  Vector3<int> *this_01;
  AssertionResult *this_02;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  AssertHelper *in_stack_ffffffffffffffc0;
  AssertionResult local_28;
  Message *in_stack_ffffffffffffffe8;
  AssertHelper *in_stack_fffffffffffffff0;
  
  this_01 = (Vector3<int> *)&stack0xffffffffffffffec;
  pica::Vector3<int>::Vector3(this_01,0xb,0xf,2);
  pica::Vector3<int>::volume(this_01);
  this_02 = &local_28;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             &this_02->success_,&this_01->x,in_stack_ffffffffffffff90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffc0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1d750c)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac,&this_02->success_);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x1d755a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d75aa);
  return;
}

Assistant:

TEST(VectorsTest, Int3Volume)
{
    Int3 v(11, 15, 2);
    ASSERT_EQ(v.volume(), 11 * 15 * 2);
}